

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O2

void __thiscall
Js::ByteCodeWriter::CallI
          (ByteCodeWriter *this,OpCode op,RegSlot returnValueRegister,RegSlot functionRegister,
          ArgSlot givenArgCount,ProfileId callSiteId,CallFlags callFlags)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  RegSlot returnValueRegister_00;
  undefined4 *puVar5;
  Type TVar6;
  uint lineNumber;
  undefined6 in_register_0000008a;
  undefined4 uVar7;
  ulong uVar8;
  uint7 uVar9;
  Type local_48;
  Type local_46;
  undefined4 local_44;
  ProfileId profileId;
  ProfileId profileId2;
  bool local_3c;
  CacheIdUnit unit;
  
  local_44 = (undefined4)CONCAT62(in_register_0000008a,callSiteId);
  uVar8 = (ulong)functionRegister;
  unit._6_2_ = op;
  CheckOpen(this);
  CheckOp(this,op,(OpLayoutType)((uint)(callFlags != CallFlags_None) * 3 + 0x1d));
  bVar3 = OpCodeAttr::HasMultiSizeLayout(op);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x4e3,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar3) goto LAB_007ccea0;
    *puVar5 = 0;
  }
  if (returnValueRegister == 0xffffffff) {
    returnValueRegister_00 = 0xffffffff;
  }
  else {
    returnValueRegister_00 = ConsumeReg(this,returnValueRegister);
  }
  unit.cacheId = ConsumeReg(this,functionRegister);
  TVar6 = (Type)local_44;
  local_46 = 0xffff;
  _profileId = 0xffffffff;
  local_48 = TVar6;
  JsUtil::
  BaseDictionary<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::TryGetValueAndRemove(this->callRegToLdFldCacheIndexMap,&unit.cacheId,(CacheIdUnit *)&profileId);
  uVar9 = (uint7)(uint3)(functionRegister >> 8);
  if ((ushort)(unit._6_2_ - 0x1f) < 4) {
    bVar3 = DoDynamicProfileOpcode(this,InlinePhase,false);
    if ((TVar6 == 0xffff) || (!bVar3)) {
      bVar3 = DoDynamicProfileOpcode(this,AggressiveIntTypeSpecPhase,false);
      if (!bVar3) {
        uVar8 = 0;
        uVar7 = 0;
        bVar4 = DoDynamicProfileOpcode(this,FloatTypeSpecPhase,false);
        bVar3 = false;
        if (!bVar4) goto LAB_007ccc2b;
      }
      TVar6 = this->m_functionWrite->profiledReturnTypeCount;
      if (TVar6 == 0xffff) {
LAB_007ccaad:
        uVar7 = 0;
      }
      else {
        this->m_functionWrite->profiledReturnTypeCount = TVar6 + 1;
        local_48 = TVar6;
        unit._6_2_ = OpCodeUtil::ConvertCallOpToProfiledReturnType(unit._6_2_);
LAB_007ccc25:
        uVar7 = (undefined4)CONCAT71((int7)(uVar8 >> 8),1);
      }
      bVar3 = false;
    }
    else {
      if (_profileId != 0xffffffff) {
        unit._6_2_ = OpCodeUtil::ConvertCallOpToProfiled(unit._6_2_,true);
        goto LAB_007ccb04;
      }
      bVar3 = false;
      unit._6_2_ = OpCodeUtil::ConvertCallOpToProfiled(unit._6_2_,false);
      uVar7 = (undefined4)CONCAT71(uVar9,1);
    }
  }
  else {
    bVar3 = DoProfileNewScObjArrayOp(this,unit._6_2_);
    if (bVar3) {
      bVar3 = DoDynamicProfileOpcode(this,NativeArrayPhase,true);
      if (bVar3) {
        if (TVar6 != 0xffff) {
LAB_007cca4e:
          TVar1 = this->m_functionWrite->profiledArrayCallSiteCount;
          if (TVar1 != 0xffff) {
            this->m_functionWrite->profiledArrayCallSiteCount = TVar1 + 1;
            local_46 = TVar1;
            OpCodeUtil::ConvertNonCallOpToProfiled((OpCode *)&unit.field_0x6);
            uVar7 = (undefined4)CONCAT71(uVar9,1);
            bVar3 = true;
            goto LAB_007ccc2b;
          }
        }
      }
      else {
        bVar3 = DoDynamicProfileOpcode(this,InlinePhase,true);
        if ((TVar6 != 0xffff) && (bVar3)) goto LAB_007cca4e;
      }
    }
    bVar3 = DoProfileNewScObjectOp(this,unit._6_2_);
    if (bVar3) {
      bVar3 = DoDynamicProfileOpcode(this,InlinePhase,true);
      if (bVar3) {
        if (TVar6 == 0xffff) goto LAB_007ccaad;
      }
      else {
        bVar4 = DoDynamicProfileOpcode(this,FixedNewObjPhase,true);
        uVar8 = 0;
        uVar7 = 0;
        if (TVar6 == 0xffff) goto LAB_007ccab8;
        bVar3 = false;
        if (!bVar4) goto LAB_007ccc2b;
      }
      if (_profileId == 0xffffffff) {
        OpCodeUtil::ConvertNonCallOpToProfiled((OpCode *)&unit.field_0x6);
        goto LAB_007ccc25;
      }
      OpCodeUtil::ConvertNonCallOpToProfiledWithICIndex((OpCode *)&unit.field_0x6);
LAB_007ccb04:
      if (callFlags == CallFlags_None) {
        bVar3 = TryWriteCallIWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                          (this,unit._6_2_,returnValueRegister_00,unit.cacheId,givenArgCount,
                           _profileId,local_3c);
        if ((bVar3) ||
           (bVar3 = TryWriteCallIWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                              (this,unit._6_2_,returnValueRegister_00,unit.cacheId,givenArgCount,
                               _profileId,local_3c), bVar3)) {
          bVar3 = false;
          goto LAB_007cce6a;
        }
        bVar3 = TryWriteCallIWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
                          (this,unit._6_2_,returnValueRegister_00,unit.cacheId,givenArgCount,
                           _profileId,local_3c);
        if (!bVar3) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar5 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                      ,0x52d,"(success)","success");
          goto joined_r0x007cce0e;
        }
      }
      else {
        bVar3 = TryWriteCallIFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                          (this,unit._6_2_,returnValueRegister_00,unit.cacheId,givenArgCount,
                           _profileId,local_3c,callFlags);
        if ((!bVar3) &&
           (bVar3 = TryWriteCallIFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                              (this,unit._6_2_,returnValueRegister_00,unit.cacheId,givenArgCount,
                               _profileId,local_3c,callFlags), !bVar3)) {
          bVar3 = TryWriteCallIFlagsWithICIndex<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
                            (this,unit._6_2_,returnValueRegister_00,unit.cacheId,givenArgCount,
                             _profileId,local_3c,callFlags);
          if (bVar3) {
            bVar3 = false;
            goto LAB_007cce6a;
          }
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar5 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                      ,0x529,"(success)","success");
joined_r0x007cce0e:
          if (!bVar3) goto LAB_007ccea0;
          *puVar5 = 0;
        }
      }
      bVar3 = false;
      goto LAB_007cce6a;
    }
LAB_007ccab8:
    uVar7 = 0;
    bVar3 = false;
  }
LAB_007ccc2b:
  local_44 = uVar7;
  if (callFlags == CallFlags_None) {
    bVar4 = TryWriteCallI<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                      (this,unit._6_2_,returnValueRegister_00,unit.cacheId,givenArgCount);
    if (((!bVar4) &&
        (bVar4 = TryWriteCallI<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                           (this,unit._6_2_,returnValueRegister_00,unit.cacheId,givenArgCount),
        !bVar4)) &&
       (bVar4 = TryWriteCallI<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
                          (this,unit._6_2_,returnValueRegister_00,unit.cacheId,givenArgCount),
       !bVar4)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      lineNumber = 0x538;
      goto LAB_007ccd76;
    }
  }
  else {
    bVar4 = TryWriteCallIFlags<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                      (this,unit._6_2_,returnValueRegister_00,unit.cacheId,givenArgCount,callFlags);
    if (((!bVar4) &&
        (bVar4 = TryWriteCallIFlags<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                           (this,unit._6_2_,returnValueRegister_00,unit.cacheId,givenArgCount,
                            callFlags), !bVar4)) &&
       (bVar4 = TryWriteCallIFlags<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
                          (this,unit._6_2_,returnValueRegister_00,unit.cacheId,givenArgCount,
                           callFlags), !bVar4)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      lineNumber = 0x534;
LAB_007ccd76:
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,lineNumber,"(success)","success");
      if (!bVar4) {
LAB_007ccea0:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar5 = 0;
    }
  }
  if ((char)local_44 == '\0') {
    return;
  }
LAB_007cce6a:
  Data::Write(&this->m_byteCodeData,&local_48,2);
  if (bVar3) {
    Data::Write(&this->m_byteCodeData,&local_46,2);
  }
  return;
}

Assistant:

void ByteCodeWriter::CallI(OpCode op, RegSlot returnValueRegister, RegSlot functionRegister, ArgSlot givenArgCount, ProfileId callSiteId, CallFlags callFlags)
    {
        CheckOpen();

        bool hasCallFlags = !(callFlags == CallFlags_None);
        if (hasCallFlags == true)
        {
            CheckOp(op, OpLayoutType::CallIFlags);
        }
        else
        {
            CheckOp(op, OpLayoutType::CallI);
        }

        Assert(OpCodeAttr::HasMultiSizeLayout(op));
        // givenArgCount could be <, ==, or > than Function's "InParams" count

        if (returnValueRegister != Js::Constants::NoRegister)
        {
            returnValueRegister = ConsumeReg(returnValueRegister);
        }
        functionRegister = ConsumeReg(functionRegister);

        bool isProfiled = false;
        bool isProfiled2 = false;
        bool isCallWithICIndex = false;
        ProfileId profileId = callSiteId;
        ProfileId profileId2 = Constants::NoProfileId;

        CacheIdUnit unit;
        unit.cacheId = Js::Constants::NoInlineCacheIndex;
        callRegToLdFldCacheIndexMap->TryGetValueAndRemove(functionRegister, &unit);
        if (DoProfileCallOp(op))
        {
            if (DoDynamicProfileOpcode(InlinePhase) &&
                callSiteId != Js::Constants::NoProfileId)
            {
                if (unit.cacheId == Js::Constants::NoInlineCacheIndex)
                {
                    op = Js::OpCodeUtil::ConvertCallOpToProfiled(op);
                }
                else
                {
                    isCallWithICIndex = true;
                    op = Js::OpCodeUtil::ConvertCallOpToProfiled(op, true);
                }
                isProfiled = true;
            }
            else if ((DoDynamicProfileOpcode(AggressiveIntTypeSpecPhase) || DoDynamicProfileOpcode(FloatTypeSpecPhase)) &&
                this->m_functionWrite->AllocProfiledReturnTypeId(&profileId))
            {
                op = Js::OpCodeUtil::ConvertCallOpToProfiledReturnType(op);
                isProfiled = true;
            }
        }
        else if (DoProfileNewScObjArrayOp(op) &&
            (DoDynamicProfileOpcode(NativeArrayPhase, true) || DoDynamicProfileOpcode(InlinePhase, true)) &&
            callSiteId != Js::Constants::NoProfileId &&
            this->m_functionWrite->AllocProfiledArrayCallSiteId(&profileId2))
        {
            OpCodeUtil::ConvertNonCallOpToProfiled(op);
            isProfiled = true;
            isProfiled2 = true;
        }
        else if (DoProfileNewScObjectOp(op) &&
            (DoDynamicProfileOpcode(InlinePhase, true) || DoDynamicProfileOpcode(FixedNewObjPhase, true)) &&
            callSiteId != Js::Constants::NoProfileId)
        {
            if (unit.cacheId == Js::Constants::NoInlineCacheIndex)
            {
                OpCodeUtil::ConvertNonCallOpToProfiled(op);
            }
            else
            {
                isCallWithICIndex = true;
                OpCodeUtil::ConvertNonCallOpToProfiledWithICIndex(op);
            }
            isProfiled = true;
        }

        if (isCallWithICIndex)
        {
            if (hasCallFlags == true)
            {
                MULTISIZE_LAYOUT_WRITE(CallIFlagsWithICIndex, op, returnValueRegister, functionRegister, givenArgCount, unit.cacheId, unit.isRootObjectCache, callFlags);
            }
            else
            {
                MULTISIZE_LAYOUT_WRITE(CallIWithICIndex, op, returnValueRegister, functionRegister, givenArgCount, unit.cacheId, unit.isRootObjectCache);
            }
        }
        else
        {
            if (hasCallFlags == true)
            {
                MULTISIZE_LAYOUT_WRITE(CallIFlags, op, returnValueRegister, functionRegister, givenArgCount, callFlags);
            }
            else
            {
                MULTISIZE_LAYOUT_WRITE(CallI, op, returnValueRegister, functionRegister, givenArgCount);
            }
        }
        if (isProfiled)
        {
            m_byteCodeData.Encode(&profileId, sizeof(Js::ProfileId));
            if (isProfiled2)
            {
                m_byteCodeData.Encode(&profileId2, sizeof(Js::ProfileId));
            }
        }
    }